

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time.cc
# Opt level: O2

bool absl::lts_20240722::ParseLenientCivilTime(string_view s,CivilHour *c)

{
  bool bVar1;
  bool bVar2;
  CivilYear *in_RCX;
  bool bVar3;
  lts_20240722 *this;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view s_05;
  string_view s_06;
  int_least64_t local_30;
  uint uStack_28;
  uint uStack_24;
  
  s_00._M_len = s._M_str;
  this = (lts_20240722 *)s._M_len;
  s_00._M_str = (char *)c;
  bVar1 = ParseCivilTime(this,s_00,(CivilHour *)in_RCX);
  bVar3 = true;
  bVar2 = true;
  if (!bVar1) {
    local_30 = 0x7b2;
    uStack_28 = 0x101;
    uStack_24 = uStack_24 & 0xffffff00;
    s_01._M_str = (char *)&local_30;
    s_01._M_len = (size_t)s_00._M_len;
    bVar1 = ParseCivilTime(this,s_01,(CivilDay *)in_RCX);
    bVar2 = bVar3;
    if (!bVar1) {
      local_30 = 0x7b2;
      uStack_28 = 0x101;
      uStack_24 = uStack_24 & 0xffffff00;
      s_02._M_str = (char *)&local_30;
      s_02._M_len = (size_t)s_00._M_len;
      bVar1 = ParseCivilTime(this,s_02,(CivilSecond *)in_RCX);
      if (!bVar1) {
        local_30 = 0x7b2;
        uStack_28 = 0x101;
        uStack_24 = uStack_24 & 0xffffff00;
        s_03._M_str = (char *)&local_30;
        s_03._M_len = (size_t)s_00._M_len;
        bVar1 = ParseCivilTime(this,s_03,(CivilHour *)in_RCX);
        if (bVar1) {
          (c->f_).y = local_30;
          (c->f_).m = (char)uStack_28;
          (c->f_).d = (char)(uStack_28 >> 8);
          (c->f_).hh = (char)(uStack_28 >> 0x10);
          (c->f_).mm = (char)(uStack_28 >> 0x18);
          (c->f_).ss = (char)uStack_24;
          *(int3 *)&(c->f_).field_0xd = (int3)(uStack_24 >> 8);
          return true;
        }
        local_30 = 0x7b2;
        uStack_28 = 0x101;
        uStack_24 = uStack_24 & 0xffffff00;
        s_04._M_str = (char *)&local_30;
        s_04._M_len = (size_t)s_00._M_len;
        bVar1 = ParseCivilTime(this,s_04,(CivilMonth *)in_RCX);
        if (!bVar1) {
          local_30 = 0x7b2;
          uStack_28 = 0x101;
          uStack_24 = uStack_24 & 0xffffff00;
          s_05._M_str = (char *)&local_30;
          s_05._M_len = (size_t)s_00._M_len;
          bVar1 = ParseCivilTime(this,s_05,(CivilMinute *)in_RCX);
          if (!bVar1) {
            local_30 = 0x7b2;
            uStack_28 = 0x101;
            uStack_24 = uStack_24 & 0xffffff00;
            s_06._M_str = (char *)&local_30;
            s_06._M_len = (size_t)s_00._M_len;
            bVar2 = ParseCivilTime(this,s_06,in_RCX);
            if (!bVar2) {
              return bVar2;
            }
          }
        }
      }
    }
    uStack_28 = uStack_28 & 0xffffff;
    (c->f_).y = local_30;
    (c->f_).m = (char)uStack_28;
    (c->f_).d = (char)(uStack_28 >> 8);
    (c->f_).hh = (char)(uStack_28 >> 0x10);
    (c->f_).mm = (char)(uStack_28 >> 0x18);
    (c->f_).ss = '\0';
  }
  return bVar2;
}

Assistant:

bool ParseLenientCivilTime(string_view s, CivilHour* c) {
  return ParseLenient(s, c);
}